

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void imul_GvEvIv(PDISASM pMyDisasm)

{
  REGISTERTYPE *pRVar1;
  Int64 *pIVar2;
  UInt8 UVar3;
  UInt8 UVar4;
  UInt8 UVar5;
  UInt8 UVar6;
  UInt8 UVar7;
  UInt8 UVar8;
  UInt8 UVar9;
  int iVar10;
  Int32 IVar11;
  ulong uVar12;
  long lStack_10;
  
  (pMyDisasm->Instruction).Category = 0x10002;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"imul",5);
  iVar10 = (pMyDisasm->Reserved_).OperandSize;
  if (iVar10 < 0x20) {
    (pMyDisasm->Reserved_).MemDecoration = 0x66;
    (pMyDisasm->Reserved_).ImmediatSize = 0x10;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Reserved_).EIP_ =
         (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
    iVar10 = Security(2,pMyDisasm);
    if (iVar10 == 0) {
      return;
    }
    uVar12 = (ulong)*(ushort *)(pMyDisasm->Reserved_).EIP_;
    (pMyDisasm->Instruction).Immediat = uVar12;
    CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand3).OpMnemonic,"%.4X",uVar12);
    IVar11 = 0x10;
    lStack_10 = 2;
  }
  else {
    (pMyDisasm->Reserved_).MemDecoration = (iVar10 == 0x40) + 0x67;
    (pMyDisasm->Reserved_).ImmediatSize = 0x20;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Operand1).AccessMode = 3;
    (pMyDisasm->Reserved_).EIP_ =
         (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
    iVar10 = Security(4,pMyDisasm);
    if (iVar10 == 0) {
      return;
    }
    uVar12 = (ulong)*(uint *)(pMyDisasm->Reserved_).EIP_;
    (pMyDisasm->Instruction).Immediat = uVar12;
    CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand3).OpMnemonic,"%.8X",uVar12);
    IVar11 = 0x20;
    lStack_10 = 4;
  }
  (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + lStack_10;
  (pMyDisasm->Operand3).OpType = 0x8040000;
  (pMyDisasm->Operand3).OpSize = IVar11;
  pRVar1 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
  *(byte *)&pRVar1->type = (byte)pRVar1->type | 0x20;
  pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
  *(byte *)pIVar2 = (byte)*pIVar2 | 1;
  UVar3 = EFLAGS_TABLE[0x26].SF_;
  UVar4 = EFLAGS_TABLE[0x26].ZF_;
  UVar5 = EFLAGS_TABLE[0x26].AF_;
  UVar6 = EFLAGS_TABLE[0x26].PF_;
  UVar7 = EFLAGS_TABLE[0x26].CF_;
  UVar8 = EFLAGS_TABLE[0x26].TF_;
  UVar9 = EFLAGS_TABLE[0x26].IF_;
  (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x26].OF_;
  (pMyDisasm->Instruction).Flags.SF_ = UVar3;
  (pMyDisasm->Instruction).Flags.ZF_ = UVar4;
  (pMyDisasm->Instruction).Flags.AF_ = UVar5;
  (pMyDisasm->Instruction).Flags.PF_ = UVar6;
  (pMyDisasm->Instruction).Flags.CF_ = UVar7;
  (pMyDisasm->Instruction).Flags.TF_ = UVar8;
  (pMyDisasm->Instruction).Flags.IF_ = UVar9;
  UVar3 = EFLAGS_TABLE[0x26].NT_;
  UVar4 = EFLAGS_TABLE[0x26].RF_;
  UVar5 = EFLAGS_TABLE[0x26].alignment;
  (pMyDisasm->Instruction).Flags.DF_ = EFLAGS_TABLE[0x26].DF_;
  (pMyDisasm->Instruction).Flags.NT_ = UVar3;
  (pMyDisasm->Instruction).Flags.RF_ = UVar4;
  (pMyDisasm->Instruction).Flags.alignment = UVar5;
  return;
}

Assistant:

void __bea_callspec__ imul_GvEvIv(PDISASM pMyDisasm)
{
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "imul");
    #endif
    if (GV.OperandSize >= 32) {
      GV.MemDecoration = (GV.OperandSize == 64) ? Arg2qword : Arg2dword;
      GV.ImmediatSize = 32;
      decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
      decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
      pMyDisasm->Operand1.AccessMode = READ + WRITE;

      GV.EIP_+= GV.DECALAGE_EIP+2;
      if (!Security(4, pMyDisasm)) return;
      pMyDisasm->Instruction.Immediat = *((UInt32*) (GV.EIP_- 0));
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand3.OpMnemonic, "%.8X",(Int64) *((UInt32*) (GV.EIP_- 0)));
      #endif
      GV.EIP_+=4;
      pMyDisasm->Operand3.OpType = CONSTANT_TYPE+ABSOLUTE_;
      pMyDisasm->Operand3.OpSize = 32;

      FillFlags(pMyDisasm, 38);
    }
    else {
      GV.MemDecoration = Arg2word;
      GV.ImmediatSize = 16;
      decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
      decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
      GV.EIP_+= GV.DECALAGE_EIP+2;
      if (!Security(2, pMyDisasm)) return;
      pMyDisasm->Instruction.Immediat = *((UInt16*) (GV.EIP_- 0));
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand3.OpMnemonic, "%.4X",(Int64) *((UInt16*) (GV.EIP_- 0)));
      #endif
      GV.EIP_+=2;
      pMyDisasm->Operand3.OpType = CONSTANT_TYPE+ABSOLUTE_;
      pMyDisasm->Operand3.OpSize = 16;

      FillFlags(pMyDisasm, 38);
    }
}